

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

uint8_t sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(uint8_t opcode)

{
  uint uVar1;
  uint8_t local_9;
  uint8_t opcode_local;
  
  uVar1 = (uint)opcode;
  if (((uVar1 == 0x11) || (uVar1 - 0x25 < 2)) || (uVar1 == 0xe0)) {
    local_9 = '\x01';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

SYSBVM_API uint8_t sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(uint8_t opcode)
{
    switch(opcode)
    {
    case SYSBVM_OPCODE_JUMP:
    case SYSBVM_OPCODE_JUMP_IF_TRUE:
    case SYSBVM_OPCODE_JUMP_IF_FALSE:
    case SYSBVM_OPCODE_CASE_JUMP:
        return 1;
    default: return 0;
    }
}